

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestPhonySelfReferenceKept::Run(ParserTestPhonySelfReferenceKept *this)

{
  State *state;
  Edge *pEVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  Node *pNVar6;
  StringPiece path;
  string err;
  char kInput [18];
  ManifestParser parser;
  string local_e8;
  string local_c8;
  char local_a8 [24];
  ManifestParser local_90;
  
  builtin_strncpy(local_a8,"build a: phony a\n",0x12);
  state = &(this->super_ParserTest).state;
  ManifestParser::ManifestParser
            (&local_90,state,(FileReader *)&(this->super_ParserTest).fs_,
             (ManifestParserOptions)0x100000000);
  pTVar2 = g_current_test;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  sVar5 = strlen(local_a8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,local_a8,local_a8 + sVar5);
  bVar3 = ManifestParser::ParseTest(&local_90,&local_e8,&local_c8);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
             ,0x195,"parser.ParseTest(kInput, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_c8);
  testing::Test::Check
            (pTVar2,iVar4 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
             ,0x196,"\"\" == err");
  path.len_ = 1;
  path.str_ = "a";
  pNVar6 = State::LookupNode(state,path);
  pEVar1 = pNVar6->in_edge_;
  bVar3 = testing::Test::Check
                    (g_current_test,
                     (long)(pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_start == 8,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                     ,0x19a,"edge->inputs_.size() == 1");
  if ((!bVar3) ||
     (bVar3 = testing::Test::Check
                        (g_current_test,
                         *(pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start == pNVar6,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                         ,0x19b,"edge->inputs_[0] == node"), !bVar3)) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(ParserTest, PhonySelfReferenceKept) {
  const char kInput[] =
"build a: phony a\n";
  ManifestParserOptions parser_opts;
  parser_opts.phony_cycle_action_ = kPhonyCycleActionError;
  ManifestParser parser(&state, &fs_, parser_opts);
  string err;
  EXPECT_TRUE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("", err);

  Node* node = state.LookupNode("a");
  Edge* edge = node->in_edge();
  ASSERT_EQ(edge->inputs_.size(), 1);
  ASSERT_EQ(edge->inputs_[0], node);
}